

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Alias::compile
          (Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Alias *this)

{
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  *pMVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  Impl *pIVar5;
  Node *resolver;
  uint64_t scopeId;
  ErrorReporter *errorReporter;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Reader expression;
  Builder brandBuilder;
  undefined1 *ptr;
  Arena *this_00;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_128;
  OrphanBuilder *local_b8;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  *local_b0;
  uint64_t local_a8;
  SegmentBuilder *pSStack_a0;
  CapTableBuilder *local_98;
  word *pwStack_90;
  SegmentReader *local_88;
  CapTableReader *pCStack_80;
  void *local_78;
  WirePointer *pWStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  StructBuilder local_58;
  
  if (this->initialized == false) {
    this->initialized = true;
    pIVar5 = this->module->compiler;
    capnp::_::OrphanBuilder::initStruct
              ((OrphanBuilder *)&local_128,(pIVar5->workspace).orphanage.arena,
               (pIVar5->workspace).orphanage.capTable,(StructSize)0x10000);
    local_a8 = CONCAT71(local_128.ptr._1_7_,local_128.ptr.isSet);
    local_98 = (CapTableBuilder *)local_128.ptr.field_1._8_8_;
    pwStack_90 = (word *)local_128.ptr.field_1._16_8_;
    pSStack_a0 = (SegmentBuilder *)local_128.ptr.field_1._0_8_;
    local_b8 = &(this->brandOrphan).builder;
    if ((this->brandOrphan).builder.segment != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize(local_b8);
    }
    (this->brandOrphan).builder.segment = pSStack_a0;
    (this->brandOrphan).builder.capTable = local_98;
    (this->brandOrphan).builder.location = pwStack_90;
    (this->brandOrphan).builder.tag.content = local_a8;
    this_00 = &(pIVar5->workspace).arena;
    local_128.ptr.isSet = true;
    local_128.ptr.field_1._0_8_ = this;
    local_b0 = __return_storage_ptr__;
    ptr = (undefined1 *)kj::Arena::allocateBytes(this_00,0x10,8,true);
    *ptr = 1;
    *(Alias **)(ptr + 8) = this;
    local_128.ptr.isSet = false;
    kj::Arena::setDestructor
              (this_00,ptr,
               kj::Arena::
               destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Alias::compile()::__0>>);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++:368:36)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:368:36)>
                 *)&local_128);
    resolver = this->parent;
    scopeId = resolver->id;
    uVar4 = resolver->genericParamCount;
    errorReporter = &this->module->parserModule->super_ErrorReporter;
    local_68._0_4_ = (this->targetName)._reader.dataSize;
    local_68._4_2_ = (this->targetName)._reader.pointerCount;
    local_68._6_2_ = *(undefined2 *)&(this->targetName)._reader.field_0x26;
    uStack_60 = *(undefined8 *)&(this->targetName)._reader.nestingLimit;
    local_78 = (this->targetName)._reader.data;
    pWStack_70 = (this->targetName)._reader.pointers;
    local_88 = (this->targetName)._reader.segment;
    pCStack_80 = (this->targetName)._reader.capTable;
    capnp::_::OrphanBuilder::asStruct(&local_58,local_b8,(StructSize)0x10000);
    expression._reader.capTable = pCStack_80;
    expression._reader.segment = local_88;
    expression._reader.data = local_78;
    expression._reader.pointers = pWStack_70;
    expression._reader.dataSize = (undefined4)local_68;
    expression._reader.pointerCount = local_68._4_2_;
    expression._reader._38_2_ = local_68._6_2_;
    expression._reader._40_8_ = uStack_60;
    brandBuilder._builder.capTable = local_58.capTable;
    brandBuilder._builder.segment = local_58.segment;
    brandBuilder._builder.data = local_58.data;
    brandBuilder._builder.pointers = local_58.pointers;
    brandBuilder._builder.dataSize = local_58.dataSize;
    brandBuilder._builder.pointerCount = local_58.pointerCount;
    brandBuilder._builder._38_2_ = local_58._38_2_;
    NodeTranslator::compileDecl
              (&local_128,scopeId,uVar4,&resolver->super_Resolver,errorReporter,expression,
               brandBuilder);
    pMVar1 = &this->target;
    __return_storage_ptr__ = local_b0;
    if (&local_128 != pMVar1) {
      if ((pMVar1->ptr).isSet == true) {
        (this->target).ptr.isSet = false;
        if ((this->target).ptr.field_1.value.tag == 1) {
          (this->target).ptr.field_1.value.tag = 0;
        }
        if ((this->target).ptr.field_1.value.tag == 2) {
          (this->target).ptr.field_1.value.tag = 0;
        }
      }
      if (local_128.ptr.isSet == true) {
        (this->target).ptr.field_1.value.tag = local_128.ptr.field_1.value.tag;
        if (local_128.ptr.field_1.value.tag == 2) {
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 8) = local_128.ptr.field_1._8_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10) = local_128.ptr.field_1._16_8_;
        }
        else if (local_128.ptr.field_1.value.tag == 1) {
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x28) = local_128.ptr.field_1._40_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x18) = local_128.ptr.field_1._24_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x20) = local_128.ptr.field_1._32_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 8) = local_128.ptr.field_1._8_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10) = local_128.ptr.field_1._16_8_;
          *(undefined1 *)((long)&(this->target).ptr.field_1 + 0x30) = local_128.ptr.field_1._48_1_;
          if (local_128.ptr.field_1._48_1_ == '\x01') {
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x58) = local_128.ptr.field_1._88_8_
            ;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x60) = local_128.ptr.field_1._96_8_
            ;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x48) = local_128.ptr.field_1._72_8_
            ;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x50) = local_128.ptr.field_1._80_8_
            ;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x38) = local_128.ptr.field_1._56_8_
            ;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x40) = local_128.ptr.field_1._64_8_
            ;
          }
        }
        (pMVar1->ptr).isSet = true;
      }
    }
  }
  bVar2 = (this->target).ptr.isSet;
  (__return_storage_ptr__->ptr).isSet = bVar2;
  if (bVar2 == true) {
    uVar4 = (this->target).ptr.field_1.value.tag;
    (__return_storage_ptr__->ptr).field_1.value.tag = uVar4;
    if (uVar4 == 2) {
      uVar6 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
           *(undefined8 *)((long)&(this->target).ptr.field_1 + 8);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar6;
    }
    else if (uVar4 == 1) {
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
           *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x28);
      uVar6 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 8);
      uVar7 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10);
      uVar8 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x20);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
           *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x18);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = uVar8;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = uVar6;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar7;
      cVar3 = *(char *)((long)&(this->target).ptr.field_1 + 0x30);
      *(char *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = cVar3;
      if (cVar3 == '\x01') {
        uVar6 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x38);
        uVar7 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x40);
        uVar8 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x48);
        uVar9 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x50);
        uVar10 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x60);
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
             *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x58);
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uVar10;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = uVar8;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uVar9;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = uVar6;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uVar7;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolveResult> Compiler::Alias::compile() {
  if (!initialized) {
    initialized = true;

    auto& workspace = module.getCompiler().getWorkspace();
    brandOrphan = workspace.orphanage.newOrphan<schema::Brand>();

    // If the Workspace is destroyed, revert the alias to the uninitialized state, because the
    // orphan we created is no longer valid in this case.
    workspace.arena.copy(kj::defer([this]() {
      initialized = false;
      brandOrphan = Orphan<schema::Brand>();
    }));

    target = NodeTranslator::compileDecl(
        parent.getId(), parent.getParameterCount(), parent,
        module.getErrorReporter(), targetName, brandOrphan.get());
  }

  return target;
}